

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_handle::set_piece_deadline
          (torrent_handle *this,piece_index_t index,int deadline,deadline_flags_t flags)

{
  int local_1c;
  torrent_handle *ptStack_18;
  int deadline_local;
  torrent_handle *this_local;
  deadline_flags_t flags_local;
  piece_index_t index_local;
  
  local_1c = deadline;
  ptStack_18 = this;
  this_local._3_1_ = flags.m_val;
  this_local._4_4_ = index.m_val;
  async_call<void(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,int,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::deadline_flags_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>&,int&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::deadline_flags_tag,void>const&>
            (this,0x683c50,(bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> *)0x0,
             (int *)((long)&this_local + 4),
             (bitfield_flag<unsigned_char,_libtorrent::deadline_flags_tag,_void> *)&local_1c);
  return;
}

Assistant:

void torrent_handle::set_piece_deadline(piece_index_t index, int deadline
		, deadline_flags_t const flags) const
	{
#ifndef TORRENT_DISABLE_STREAMING
		async_call(&aux::torrent::set_piece_deadline, index, deadline, flags);
#else
		TORRENT_UNUSED(deadline);
		if (flags & alert_when_available)
			async_call(&aux::torrent::read_piece, index);
#endif
	}